

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

char * getstring_aux(lua_State *L,char *buff,char **pc)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int local_24;
  int quote;
  int i;
  char **pc_local;
  char *buff_local;
  lua_State *L_local;
  
  local_24 = 0;
  skip(pc);
  if ((**pc == '\"') || (**pc == '\'')) {
    pcVar2 = *pc;
    *pc = pcVar2 + 1;
    cVar1 = *pcVar2;
    while (**pc != cVar1) {
      if (**pc == '\0') {
        luaL_error(L,"unfinished string in C script");
      }
      pcVar2 = *pc;
      *pc = pcVar2 + 1;
      buff[local_24] = *pcVar2;
      local_24 = local_24 + 1;
    }
    *pc = *pc + 1;
  }
  else {
    while( true ) {
      bVar3 = false;
      if (**pc != '\0') {
        pcVar2 = strchr(" \t\n,;",(int)**pc);
        bVar3 = pcVar2 == (char *)0x0;
      }
      if (!bVar3) break;
      pcVar2 = *pc;
      *pc = pcVar2 + 1;
      buff[local_24] = *pcVar2;
      local_24 = local_24 + 1;
    }
  }
  buff[local_24] = '\0';
  return buff;
}

Assistant:

static const char *getstring_aux (lua_State *L, char *buff, const char **pc) {
  int i = 0;
  skip(pc);
  if (**pc == '"' || **pc == '\'') {  /* quoted string? */
    int quote = *(*pc)++;
    while (**pc != quote) {
      if (**pc == '\0') luaL_error(L, "unfinished string in C script");
      buff[i++] = *(*pc)++;
    }
    (*pc)++;
  }
  else {
    while (**pc != '\0' && !strchr(delimits, **pc))
      buff[i++] = *(*pc)++;
  }
  buff[i] = '\0';
  return buff;
}